

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_thread.cpp
# Opt level: O2

void __thiscall FuncThread::FuncThread(FuncThread *this,shared_ptr<InfoRouter> *router)

{
  _Rb_tree_header *p_Var1;
  
  cppnet::ThreadWithQueue<FuncCallInfo_*>::ThreadWithQueue
            (&this->super_ThreadWithQueue<FuncCallInfo_*>);
  (this->super_ThreadWithQueue<FuncCallInfo_*>).super_Thread._vptr_Thread =
       (_func_int **)&PTR__FuncThread_00134688;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var1 = &(this->_func_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_func_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_func_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_func_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_func_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_func_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__shared_ptr<InfoRouter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_func_router).super___shared_ptr<InfoRouter,_(__gnu_cxx::_Lock_policy)2>,
             &router->super___shared_ptr<InfoRouter,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

FuncThread::FuncThread(std::shared_ptr<InfoRouter>& router):
    _func_router(router) {
}